

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O1

CURLcode Curl_output_digest(connectdata *conn,_Bool proxy,uchar *request,uchar *uripath)

{
  char *pcVar1;
  Curl_easy *data;
  bool bVar2;
  char **ppcVar3;
  undefined1 uVar4;
  CURLcode CVar5;
  uchar *uripath_00;
  ulong uVar6;
  long lVar7;
  int iVar8;
  undefined7 in_register_00000031;
  char **ppcVar9;
  char *pcVar10;
  char *pcVar11;
  char *response;
  long local_58;
  char *local_50;
  char *local_48;
  uchar *local_40;
  size_t len;
  
  data = conn->data;
  iVar8 = (int)CONCAT71(in_register_00000031,proxy);
  uVar6 = (ulong)(uint)(iVar8 << 5) | 0x4bd8;
  ppcVar3 = &conn->user;
  ppcVar9 = &conn->passwd;
  lVar7 = 0x450;
  if (iVar8 != 0) {
    lVar7 = 0x438;
    ppcVar9 = &(conn->http_proxy).passwd;
    ppcVar3 = &(conn->http_proxy).user;
  }
  pcVar10 = *ppcVar9;
  pcVar11 = *ppcVar3;
  local_40 = request;
  (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar7 + -0x20));
  if (pcVar11 == (char *)0x0) {
    pcVar11 = "";
  }
  if (pcVar10 == (char *)0x0) {
    pcVar10 = "";
  }
  pcVar1 = (conn->chunk).hexbuffer + lVar7 + -0x20;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  uVar4 = 0;
  if (*(long *)((long)((data->state).tempwrite + 4) + (ulong)(uint)(iVar8 << 6) + 8) != 0) {
    bVar2 = true;
    local_58 = lVar7;
    local_50 = pcVar11;
    local_48 = pcVar10;
    if (*(char *)((long)data->sockets + (uVar6 - 0x66)) == '\x01') {
      pcVar10 = strchr((char *)uripath,0x3f);
      if (pcVar10 == (char *)0x0) {
        uripath_00 = (uchar *)0x0;
      }
      else {
        bVar2 = false;
        uripath_00 = (uchar *)curl_maprintf("%.*s",(long)pcVar10 - (long)uripath,uripath);
      }
    }
    else {
      uripath_00 = (uchar *)0x0;
    }
    if (bVar2) {
      uripath_00 = (uchar *)(*Curl_cstrdup)((char *)uripath);
    }
    if (uripath_00 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar5 = Curl_auth_create_digest_http_message
                      (data,local_50,local_48,local_40,uripath_00,
                       (digestdata *)
                       ((long)((data->state).tempwrite + 4) + (ulong)(uint)(iVar8 << 6) + 8),
                       &response,&len);
    (*Curl_cfree)(uripath_00);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    pcVar10 = "";
    if (proxy) {
      pcVar10 = "Proxy-";
    }
    pcVar10 = curl_maprintf("%sAuthorization: Digest %s\r\n",pcVar10,response);
    lVar7 = local_58;
    *(char **)((conn->chunk).hexbuffer + local_58 + -0x20) = pcVar10;
    (*Curl_cfree)(response);
    uVar4 = 1;
    if (*(long *)((conn->chunk).hexbuffer + lVar7 + -0x20) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  *(undefined1 *)((long)data->sockets + (uVar6 - 0x68)) = uVar4;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_digest(struct connectdata *conn,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  unsigned char *path = NULL;
  char *tmp = NULL;
  char *response;
  size_t len;
  bool have_chlg;

  /* Point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* Point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* Point to the correct struct with this */
  struct digestdata *digest;
  struct auth *authp;

  if(proxy) {
    digest = &data->state.proxydigest;
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->http_proxy.user;
    passwdp = conn->http_proxy.passwd;
    authp = &data->state.authproxy;
  }
  else {
    digest = &data->state.digest;
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#if defined(USE_WINDOWS_SSPI)
  have_chlg = digest->input_token ? TRUE : FALSE;
#else
  have_chlg = digest->nonce ? TRUE : FALSE;
#endif

  if(!have_chlg) {
    authp->done = FALSE;
    return CURLE_OK;
  }

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     https://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle) {
    tmp = strchr((char *)uripath, '?');
    if(tmp) {
      size_t urilen = tmp - (char *)uripath;
      path = (unsigned char *) aprintf("%.*s", urilen, uripath);
    }
  }
  if(!tmp)
    path = (unsigned char *) strdup((char *) uripath);

  if(!path)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_auth_create_digest_http_message(data, userp, passwdp, request,
                                                path, digest, &response, &len);
  free(path);
  if(result)
    return result;

  *allocuserpwd = aprintf("%sAuthorization: Digest %s\r\n",
                          proxy ? "Proxy-" : "",
                          response);
  free(response);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  authp->done = TRUE;

  return CURLE_OK;
}